

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_coverageNestedImportsClearingModels_Test::TestBody
          (Importer_coverageNestedImportsClearingModels_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  long *local_98;
  long *local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  long local_80 [2];
  AssertionResult local_70;
  long local_60 [2];
  AssertHelper local_50 [8];
  shared_ptr *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"importer/nested_components.cellml","");
  fileContents((string *)&local_70);
  libcellml::Parser::parseModel(local_38);
  if ((long *)CONCAT71(local_70._1_7_,local_70.success_) != local_60) {
    operator_delete((long *)CONCAT71(local_70._1_7_,local_70.success_),local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = (long *)0x0;
  local_48 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_48);
  if (local_70.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_70.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Importer::create(SUB81(&local_48,0));
  psVar1 = local_48;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"importer/","");
  resourcePath((string *)&local_70);
  libcellml::Importer::resolveImports(psVar1,local_38);
  if ((long *)CONCAT71(local_70._1_7_,local_70.success_) != local_60) {
    operator_delete((long *)CONCAT71(local_70._1_7_,local_70.success_),local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = (long *)0x0;
  local_98 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_98);
  if (local_70.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_70.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,700,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_90 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_90 = (long *)(CONCAT71(local_90._1_7_,cVar2) ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)&local_90,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2be,(char *)CONCAT71(local_70._1_7_,local_70.success_));
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((long *)CONCAT71(local_70._1_7_,local_70.success_) != local_60) {
      operator_delete((long *)CONCAT71(local_70._1_7_,local_70.success_),local_60[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::clearImports(local_48);
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_90 = (long *)CONCAT71(local_90._1_7_,cVar2);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)&local_90,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2c0,(char *)CONCAT71(local_70._1_7_,local_70.success_));
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((long *)CONCAT71(local_70._1_7_,local_70.success_) != local_60) {
      operator_delete((long *)CONCAT71(local_70._1_7_,local_70.success_),local_60[0] + 1);
    }
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, coverageNestedImportsClearingModels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/nested_components.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(0), importer->issueCount());

    EXPECT_FALSE(model->hasUnresolvedImports());
    importer->clearImports(model);
    EXPECT_TRUE(model->hasUnresolvedImports());
}